

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.cpp
# Opt level: O2

bool compareData<int>(Serializer *serializer1,Serializer *serializer2,Savepoint *savepoint,
                     DataFieldInfo *info1,DataFieldInfo *info2,IJKLBounds *bounds,double tolerance,
                     vector<bool,_std::allocator<bool>_> *failed)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong *puVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  long lVar12;
  int iVar13;
  size_type __n;
  double dVar14;
  ulong in_XMM5_Qb;
  reference rVar15;
  int *data2;
  int *data1;
  int *local_70;
  int *local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  double local_48;
  ulong uStack_40;
  
  readData<int>(serializer1,info1,savepoint,&local_68);
  readData<int>(serializer2,info2,savepoint,&local_70);
  iVar1 = info1->jSize_;
  iVar2 = info1->kSize_;
  iVar3 = info1->lSize_;
  bVar11 = 0;
  std::vector<bool,_std::allocator<bool>_>::resize
            (failed,(long)(iVar2 * iVar3 * info1->iSize_ * iVar1),false);
  iVar4 = bounds->iLower;
  iVar6 = iVar1 * iVar4;
  for (; iVar4 <= bounds->iUpper; iVar4 = iVar4 + 1) {
    uVar8 = bounds->jLower;
    uVar7 = (iVar6 + uVar8) * iVar2;
    while( true ) {
      if (bounds->jUpper < (int)uVar8) break;
      iVar13 = (bounds->kLower + uVar7) * iVar3;
      lVar9 = (long)bounds->kLower;
      local_60 = (ulong)uVar7;
      local_58 = (ulong)uVar8;
      while (lVar9 <= bounds->kUpper) {
        lVar12 = (long)bounds->lLower;
        __n = iVar13 + lVar12;
        local_50 = lVar9;
        for (; lVar12 <= bounds->lUpper; lVar12 = lVar12 + 1) {
          dVar14 = (double)local_70[__n];
          local_48 = ABS((dVar14 - (double)local_68[__n]) /
                         (double)(~-(ulong)(1.0 < ABS(dVar14)) & 0x3ff0000000000000 |
                                 -(ulong)(1.0 < ABS(dVar14)) & (ulong)dVar14));
          in_XMM5_Qb = in_XMM5_Qb & 0x7fffffffffffffff;
          uStack_40 = in_XMM5_Qb;
          rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[](failed,__n);
          puVar5 = rVar15._M_p;
          if (local_48 <= tolerance) {
            uVar10 = ~rVar15._M_mask & *puVar5;
          }
          else {
            uVar10 = rVar15._M_mask | *puVar5;
          }
          *puVar5 = uVar10;
          bVar11 = bVar11 | tolerance < local_48;
          __n = __n + 1;
        }
        iVar13 = iVar13 + iVar3;
        lVar9 = local_50 + 1;
      }
      uVar8 = (int)local_58 + 1;
      uVar7 = (int)local_60 + iVar2;
    }
    iVar6 = iVar6 + iVar1;
  }
  if (local_68 != (int *)0x0) {
    operator_delete__(local_68);
  }
  if (local_70 != (int *)0x0) {
    operator_delete__(local_70);
  }
  return (bool)(~bVar11 & 1);
}

Assistant:

bool compareData(const Serializer& serializer1, const Serializer& serializer2,
                 const Savepoint& savepoint,
                 const DataFieldInfo& info1, const DataFieldInfo& info2,
                 const IJKLBounds& bounds,
                 double tolerance, vector<bool>& failed)
{
    T* data1;
    readData(serializer1, info1, savepoint, data1);

    T* data2;
    readData(serializer2, info2, savepoint, data2);

    int iSize = info1.iSize();
    int jSize = info1.jSize();
    int kSize = info1.kSize();
    int lSize = info1.lSize();

    bool notequal = false;
    failed.resize(iSize * jSize * kSize * lSize);

    for (int i = bounds.iLower; i <= bounds.iUpper; ++i) {
        for (int j = bounds.jLower; j <= bounds.jUpper; ++j) {
            for (int k = bounds.kLower; k <= bounds.kUpper; ++k) {
                for (int l = bounds.lLower; l <= bounds.lUpper; ++l) {
                    int index = i * jSize * kSize * lSize + j * kSize * lSize + k * lSize + l;

                    const double val = static_cast<double>(data1[index]);
                    const double ref = static_cast<double>(data2[index]);
                    const double err = std::fabs(ref) > 1. ?
                                       std::fabs((ref - val) / ref) : std::fabs(ref - val);

                    const bool f = err > tolerance         // Error is too large (e.g. val is infinite, ref is not)
                        || ((val != val) != (ref != ref))  // Exactly one is NaN
                        || (err != err && ref != val);     // ref is infinite, val different

                    failed[index] = f;
                    notequal = notequal || f;
                }
            }
        }
    }

    delete [] data1;
    delete [] data2;

    return !notequal;
}